

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.h
# Opt level: O0

char * google::protobuf::io::mutable_string_data(string *s)

{
  char *pcVar1;
  string *s_local;
  
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
  return pcVar1;
}

Assistant:

inline char* mutable_string_data(string* s) {
#ifdef LANG_CXX11
  // This should be simpler & faster than string_as_array() because the latter
  // is guaranteed to return NULL when *s is empty, so it has to check for that.
  return &(*s)[0];
#else
  return string_as_array(s);
#endif
}